

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlineedit_p.cpp
# Opt level: O0

QRect __thiscall QLineEditPrivate::adjustedControlRect(QLineEditPrivate *this,QRect *rect)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  QRect *in_RSI;
  QLineEditPrivate *in_RDI;
  long in_FS_OFFSET;
  QRect QVar5;
  int cix;
  QRect cr;
  QRect widgetRect;
  int in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  QLineEditPrivate *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffffa0;
  int iVar6;
  QFontMetrics local_38 [16];
  undefined1 local_28 [16];
  undefined1 local_18 [16];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_18._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  bVar1 = QRect::isEmpty((QRect *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  if (bVar1) {
    q_func(in_RDI);
    local_18 = (undefined1  [16])QWidget::rect((QWidget *)in_stack_ffffffffffffff88);
  }
  else {
    local_18 = *(undefined1 (*) [16])in_RSI;
  }
  local_28._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_28._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_28 = (undefined1  [16])adjustedContentsRect(in_stack_ffffffffffffff88);
  iVar2 = QRect::x((QRect *)0x5d0a96);
  iVar4 = (iVar2 - in_RDI->hscroll) + 2;
  iVar2 = in_RDI->vscroll;
  iVar6 = iVar4;
  iVar3 = QWidgetLineControl::ascent((QWidgetLineControl *)in_RDI->control);
  iVar3 = iVar2 - iVar3;
  q_func(in_RDI);
  QWidget::fontMetrics((QWidget *)CONCAT44(iVar2,in_stack_ffffffffffffff68));
  QFontMetrics::ascent();
  QPoint::QPoint((QPoint *)CONCAT44(iVar4,iVar3),iVar2,in_stack_ffffffffffffff68);
  QVar5 = QRect::translated(in_RSI,(QPoint *)CONCAT44(iVar6,in_stack_ffffffffffffffa0));
  QFontMetrics::~QFontMetrics(local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return QVar5;
  }
  __stack_chk_fail();
}

Assistant:

QRect QLineEditPrivate::adjustedControlRect(const QRect &rect) const
{
    QRect widgetRect = !rect.isEmpty() ? rect : q_func()->rect();
    QRect cr = adjustedContentsRect();
    int cix = cr.x() - hscroll + horizontalMargin;
    return widgetRect.translated(QPoint(cix, vscroll - control->ascent() + q_func()->fontMetrics().ascent()));
}